

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# our_gl.cpp
# Opt level: O0

mat4 * viewport(mat4 *__return_storage_ptr__,int x,int y,int w,int h)

{
  vec<4UL,_double> *pvVar1;
  double *pdVar2;
  mat4 *Viewport;
  int h_local;
  int w_local;
  int y_local;
  int x_local;
  
  mat<4UL,_4UL>::identity();
  pvVar1 = mat<4UL,_4UL>::operator[](__return_storage_ptr__,0);
  pdVar2 = vec<4UL,_double>::operator[](pvVar1,3);
  *pdVar2 = (double)((float)x + (float)w / 2.0);
  pvVar1 = mat<4UL,_4UL>::operator[](__return_storage_ptr__,1);
  pdVar2 = vec<4UL,_double>::operator[](pvVar1,3);
  *pdVar2 = (double)((float)y + (float)h / 2.0);
  pvVar1 = mat<4UL,_4UL>::operator[](__return_storage_ptr__,2);
  pdVar2 = vec<4UL,_double>::operator[](pvVar1,3);
  *pdVar2 = 127.5;
  pvVar1 = mat<4UL,_4UL>::operator[](__return_storage_ptr__,0);
  pdVar2 = vec<4UL,_double>::operator[](pvVar1,0);
  *pdVar2 = (double)((float)w / 2.0);
  pvVar1 = mat<4UL,_4UL>::operator[](__return_storage_ptr__,1);
  pdVar2 = vec<4UL,_double>::operator[](pvVar1,1);
  *pdVar2 = (double)((float)h / 2.0);
  pvVar1 = mat<4UL,_4UL>::operator[](__return_storage_ptr__,2);
  pdVar2 = vec<4UL,_double>::operator[](pvVar1,2);
  *pdVar2 = 127.5;
  return __return_storage_ptr__;
}

Assistant:

mat4 viewport(int x, int y, int w, int h)
{
    mat4 Viewport = mat4::identity();
    Viewport[0][3] = x + w / 2.f;
    Viewport[1][3] = y + h / 2.f;
    Viewport[2][3] = 255.f / 2.f;
    Viewport[0][0] = w / 2.f;
    Viewport[1][1] = h / 2.f;
    Viewport[2][2] = 255.f / 2.f;
    return Viewport;
}